

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O1

AssertionResult * __thiscall
iuutil::
CmpHelperEqIterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int_const*>
          (AssertionResult *__return_storage_ptr__,iuutil *this,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> b1,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> e1,int *b2,int *e2
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  undefined8 extraout_RAX;
  iuStreamMessage *piVar4;
  AssertionResult *pAVar5;
  int iVar6;
  AssertionResult *pAVar7;
  bool bVar8;
  bool bVar9;
  Message ar;
  int local_3b0;
  uint local_3ac;
  AssertionResult *local_3a8;
  ios_base *local_3a0;
  iuutil *local_398;
  int *local_390;
  AssertionResult local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  AssertionResult local_340 [3];
  ios_base local_2c0 [264];
  undefined1 local_1b8 [392];
  
  local_3b0 = 0;
  local_3a8 = __return_storage_ptr__;
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  local_3b0 = 0;
  bVar8 = this != (iuutil *)b1._M_current;
  bVar9 = e1._M_current != b2;
  local_398 = (iuutil *)b1._M_current;
  local_390 = b2;
  if (bVar8 && bVar9) {
    local_3a0 = local_2c0;
    local_3ac = (uint)CONCAT71((int7)((ulong)local_3a0 >> 8),1);
    do {
      iutest::internal::CmpHelperEQ<int,int>
                (&local_388,(internal *)0x17017c,"",(char *)this,e1._M_current,e2);
      iutest::AssertionResult::operator!(local_340,&local_388);
      bVar9 = local_340[0].m_result;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340[0].m_message._M_dataplus._M_p != &local_340[0].m_message.field_2) {
        operator_delete(local_340[0].m_message._M_dataplus._M_p,
                        CONCAT71(local_340[0].m_message.field_2._M_allocated_capacity._1_7_,
                                 local_340[0].m_message.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388.m_message._M_dataplus._M_p != &local_388.m_message.field_2) {
        operator_delete(local_388.m_message._M_dataplus._M_p,
                        local_388.m_message.field_2._M_allocated_capacity + 1);
      }
      if (bVar9 != false) {
        piVar4 = iutest::detail::iuStreamMessage::operator<<
                           ((iuStreamMessage *)local_1b8,(char (*) [25])"\nMismatch in a position ")
        ;
        piVar4 = iutest::detail::iuStreamMessage::operator<<(piVar4,&local_3b0);
        piVar4 = iutest::detail::iuStreamMessage::operator<<(piVar4,(char (*) [3])0x16ddda);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_340);
        std::ostream::operator<<(&local_340[0].m_message.field_2,*(int *)this);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_3a0);
        piVar4 = iutest::detail::iuStreamMessage::operator<<(piVar4,&local_388.m_message);
        piVar4 = iutest::detail::iuStreamMessage::operator<<(piVar4,(char (*) [5])" vs ");
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_340);
        std::ostream::operator<<(&local_340[0].m_message.field_2,*e1._M_current);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_3a0);
        iutest::detail::iuStreamMessage::operator<<(piVar4,&local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388.m_message._M_dataplus._M_p != &local_388.m_message.field_2) {
          operator_delete(local_388.m_message._M_dataplus._M_p,
                          local_388.m_message.field_2._M_allocated_capacity + 1);
        }
        local_3ac = 0;
      }
      this = this + 4;
      e1._M_current = e1._M_current + 1;
      local_3b0 = local_3b0 + 1;
      bVar9 = e1._M_current != local_390;
      bVar8 = this != local_398;
    } while ((bVar8) && (e1._M_current != local_390));
  }
  else {
    local_3ac = (uint)CONCAT71((uint7)((ulong)extraout_RAX >> 8) & 0xffffff,1);
  }
  uVar3 = local_3ac;
  if (bVar8) {
    iVar6 = local_3b0;
    if (this != local_398) {
      iVar6 = local_3b0 + (int)((ulong)(local_398 + (0x3fffffffc - (long)this)) >> 2) + 1;
    }
    local_340[0].m_message._M_dataplus._M_p._0_4_ = iVar6;
    piVar4 = iutest::detail::iuStreamMessage::operator<<
                       ((iuStreamMessage *)local_1b8,(char (*) [21])"\nMismatch element : ");
    piVar4 = iutest::detail::iuStreamMessage::operator<<(piVar4,(int *)local_340);
    piVar4 = iutest::detail::iuStreamMessage::operator<<(piVar4,(char (*) [5])" vs ");
    iutest::detail::iuStreamMessage::operator<<(piVar4,&local_3b0);
    uVar3 = 0;
  }
  if (bVar9) {
    iVar6 = local_3b0;
    if (e1._M_current != local_390) {
      iVar6 = local_3b0 + (int)((ulong)((long)local_390 + (0x3fffffffc - (long)e1._M_current)) >> 2)
              + 1;
    }
    local_340[0].m_message._M_dataplus._M_p._0_4_ = iVar6;
    piVar4 = iutest::detail::iuStreamMessage::operator<<
                       ((iuStreamMessage *)local_1b8,(char (*) [21])"\nMismatch element : ");
    piVar4 = iutest::detail::iuStreamMessage::operator<<(piVar4,&local_3b0);
    piVar4 = iutest::detail::iuStreamMessage::operator<<(piVar4,(char (*) [5])" vs ");
    iutest::detail::iuStreamMessage::operator<<(piVar4,(int *)local_340);
    uVar3 = 0;
  }
  if ((uVar3 & 1) == 0) {
    paVar1 = &local_340[0].m_message.field_2;
    local_340[0].m_message._M_string_length = 0;
    local_340[0].m_message.field_2._M_local_buf[0] = '\0';
    local_340[0].m_result = false;
    local_340[0].m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar5 = iutest::AssertionResult::operator<<(local_340,(iuStreamMessage *)local_1b8);
    pAVar7 = local_3a8;
    (local_3a8->m_message)._M_dataplus._M_p = (pointer)&(local_3a8->m_message).field_2;
    pcVar2 = (pAVar5->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3a8,pcVar2,pcVar2 + (pAVar5->m_message)._M_string_length);
    pAVar7->m_result = pAVar5->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340[0].m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_340[0].m_message._M_dataplus._M_p,
                      CONCAT71(local_340[0].m_message.field_2._M_allocated_capacity._1_7_,
                               local_340[0].m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (local_3a8->m_message)._M_dataplus._M_p = (pointer)&(local_3a8->m_message).field_2;
    (local_3a8->m_message)._M_string_length = 0;
    (local_3a8->m_message).field_2._M_local_buf[0] = '\0';
    local_3a8->m_result = true;
    pAVar7 = local_3a8;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  return pAVar7;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = true;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::EqHelper<false>::Compare("", "", *b1, *b2))
        {
            result = false;
            ar << "\nMismatch in a position " << elem << ": "
                << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2)
                << " vs " << ::iutest::internal::FormatForComparisonFailureMessage(*b2, *b1);
        }
    }
    if(b1 != e1)
    {
        int elem1 = elem;
        for(; b1 != e1; ++b1, ++elem1) {}
        result = false;
        ar << "\nMismatch element : " << elem1 << " vs " << elem;
    }
    if(b2 != e2)
    {
        int elem2 = elem;
        for(; b2 != e2; ++b2, ++elem2) {}
        result = false;
        ar << "\nMismatch element : " << elem << " vs " << elem2;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}